

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall
FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor>::dump_WaveAudioDescriptor
          (FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *this,FILE *stream)

{
  int iVar1;
  long *plVar2;
  Dictionary *this_00;
  byte_t *pbVar3;
  UL *pUVar4;
  undefined8 uVar5;
  undefined1 local_d8 [8];
  char buf [64];
  Result_t local_90 [8];
  Result_t result;
  WaveAudioDescriptor *descriptor;
  Dictionary *Dict;
  FILE *stream_local;
  FileInfoWrapper<AS_02::PCM::MXFReader,_MyAudioDescriptor> *this_local;
  
  ASDCP::DefaultCompositeDict();
  plVar2 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
  this_00 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(this_00,MDD_WaveAudioDescriptor);
  (**(code **)(*plVar2 + 0xa8))(local_90,plVar2,pbVar3);
  iVar1 = Kumu::Result_t::operator_cast_to_int(local_90);
  if (-1 < iVar1) {
    pUVar4 = ASDCP::MXF::optional_property<ASDCP::UL>::const_get
                       ((optional_property<ASDCP::UL> *)0x1c0);
    uVar5 = ASDCP::UL::EncodeString((char *)pUVar4,(uint)local_d8);
    fprintf((FILE *)stream,"ChannelAssignment: %s\n",uVar5);
  }
  Kumu::Result_t::~Result_t(local_90);
  return;
}

Assistant:

void dump_WaveAudioDescriptor(FILE* stream = 0)
  {
    const Dictionary& Dict = DefaultCompositeDict();
    MXF::WaveAudioDescriptor *descriptor = 0;

    Result_t result = m_Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_WaveAudioDescriptor),
							      reinterpret_cast<MXF::InterchangeObject**>(&descriptor));

    if ( KM_SUCCESS(result) )
      {
    	char buf[64];
    	fprintf(stream, "ChannelAssignment: %s\n", descriptor->ChannelAssignment.const_get().EncodeString(buf, 64));
      }
  }